

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
Generator_hodgkinHuxleySquidAxonModel1952WithStateVariableAsExternalVariable_Test::TestBody
          (Generator_hodgkinHuxleySquidAxonModel1952WithStateVariableAsExternalVariable_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  allocator<char> local_e1;
  AssertionResult gtest_ar;
  unsigned_long local_c0 [4];
  AssertionResult gtest_ar_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  GeneratorPtr generator;
  AnalyserModelPtr analyserModel;
  GeneratorProfilePtr profile;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",
             (allocator<char> *)&local_90);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_c0);
  local_c0[0] = 0;
  local_90._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",local_c0,
             (unsigned_long *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x4d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Analyser::create();
  peVar1 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"sodium_channel",(allocator<char> *)&profile);
  libcellml::ComponentEntity::component
            ((string *)&generator,
             (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _0_1_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"m",(allocator<char> *)&gtest_ar_2);
  libcellml::Component::variable((string *)&analyserModel);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_90);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyserModel.super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_c0[0] = 0;
  local_90._M_dataplus._M_p = (pointer)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","analyser->errorCount()",local_c0,
             (unsigned_long *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x4da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  libcellml::Generator::setModel
            ((shared_ptr *)
             generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Generator::profile();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"model.state.h",(allocator<char> *)local_c0);
  libcellml::GeneratorProfile::setInterfaceFileNameString
            ((string *)
             profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"generator/hodgkin_huxley_squid_axon_model_1952/model.state.h",
             &local_e1);
  fileContents((string *)&gtest_ar);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.state.h\")",
             "generator->interfaceCode()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_c0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x4e5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"generator/hodgkin_huxley_squid_axon_model_1952/model.state.c",
             &local_e1);
  fileContents((string *)&gtest_ar);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.state.c\")",
             "generator->implementationCode()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_c0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x4e6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  libcellml::GeneratorProfile::create
            ((Profile)(__shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2> *)
                      &gtest_ar);
  std::__shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  libcellml::Generator::setProfile
            ((shared_ptr *)
             generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"generator/hodgkin_huxley_squid_axon_model_1952/model.state.py",
             &local_e1);
  fileContents((string *)&gtest_ar);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.state.py\")",
             "generator->implementationCode()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_c0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x4ec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyserModel.super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Generator, hodgkinHuxleySquidAxonModel1952WithStateVariableAsExternalVariable)
{
    // Generate some code for the HH52 model with sodium_channel.m (i.e. not a
    // primary variable) as an external variable.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("sodium_channel")->variable("m")));

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    auto profile = generator->profile();

    profile->setInterfaceFileNameString("model.state.h");

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.state.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.state.c"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.state.py"), generator->implementationCode());
}